

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_attribute_decoders_controller.cc
# Opt level: O3

bool __thiscall
draco::SequentialAttributeDecodersController::DecodeAttributesDecoderData
          (SequentialAttributeDecodersController *this,DecoderBuffer *buffer)

{
  long lVar1;
  byte bVar2;
  pointer puVar3;
  __uniq_ptr_impl<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
  _Var4;
  _Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false> _Var5;
  bool bVar6;
  char cVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  _Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false> local_40;
  ulong local_38;
  
  bVar6 = AttributesDecoder::DecodeAttributesDecoderData(&this->super_AttributesDecoder,buffer);
  if (bVar6) {
    uVar8 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
              _vptr_AttributesDecoderInterface[6])(this);
    std::
    vector<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
    ::resize(&this->sequential_decoders_,(long)(int)uVar8);
    bVar6 = true;
    if (0 < (int)uVar8) {
      local_38 = (ulong)uVar8;
      uVar11 = 0;
      do {
        lVar1 = buffer->pos_ + 1;
        if (buffer->data_size_ < lVar1) goto LAB_0015cb10;
        bVar2 = buffer->data_[buffer->pos_];
        buffer->pos_ = lVar1;
        (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
          _vptr_AttributesDecoderInterface[0xc])(&local_40,this,(ulong)bVar2);
        _Var5._M_head_impl = local_40._M_head_impl;
        puVar3 = (this->sequential_decoders_).
                 super__Vector_base<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_40._M_head_impl = (SequentialAttributeDecoder *)0x0;
        _Var4._M_t.
        super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
        .super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>._M_head_impl =
             puVar3[uVar11]._M_t.
             super___uniq_ptr_impl<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
             ._M_t;
        puVar3[uVar11]._M_t.
        super___uniq_ptr_impl<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
        ._M_t = (tuple<draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
                 )_Var5._M_head_impl;
        if ((_Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
             )_Var4._M_t.
              super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
              .super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>._M_head_impl !=
            (SequentialAttributeDecoder *)0x0) {
          (**(code **)(*(long *)_Var4._M_t.
                                super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
                                .super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>.
                                _M_head_impl + 8))();
        }
        if (local_40._M_head_impl != (SequentialAttributeDecoder *)0x0) {
          (*(local_40._M_head_impl)->_vptr_SequentialAttributeDecoder[1])();
        }
        _Var4._M_t.
        super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
        .super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>._M_head_impl =
             (this->sequential_decoders_).
             super__Vector_base<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_t.
             super___uniq_ptr_impl<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
             ._M_t;
        if ((_Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
             )_Var4._M_t.
              super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
              .super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>._M_head_impl ==
            (SequentialAttributeDecoder *)0x0) goto LAB_0015cb10;
        iVar9 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                  _vptr_AttributesDecoderInterface[7])(this);
        iVar10 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                   _vptr_AttributesDecoderInterface[5])(this,uVar11 & 0xffffffff);
        cVar7 = (**(code **)(*(long *)_Var4._M_t.
                                      super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
                                      .
                                      super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>
                                      ._M_head_impl + 0x10))
                          (_Var4._M_t.
                           super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
                           .super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>.
                           _M_head_impl,iVar9,iVar10);
        if (cVar7 == '\0') goto LAB_0015cb10;
        uVar11 = uVar11 + 1;
      } while (local_38 != uVar11);
      bVar6 = true;
    }
  }
  else {
LAB_0015cb10:
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool SequentialAttributeDecodersController::DecodeAttributesDecoderData(
    DecoderBuffer *buffer) {
  if (!AttributesDecoder::DecodeAttributesDecoderData(buffer)) {
    return false;
  }
  // Decode unique ids of all sequential encoders and create them.
  const int32_t num_attributes = GetNumAttributes();
  sequential_decoders_.resize(num_attributes);
  for (int i = 0; i < num_attributes; ++i) {
    uint8_t decoder_type;
    if (!buffer->Decode(&decoder_type)) {
      return false;
    }
    // Create the decoder from the id.
    sequential_decoders_[i] = CreateSequentialDecoder(decoder_type);
    if (!sequential_decoders_[i]) {
      return false;
    }
    if (!sequential_decoders_[i]->Init(GetDecoder(), GetAttributeId(i))) {
      return false;
    }
  }
  return true;
}